

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_VavoomSlope(sector_t_conflict *sec,int id,DVector3 *pos,int which)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double aa;
  double bb;
  line_t_conflict *plVar5;
  double this;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double local_d8;
  secplane_t *local_d0;
  double dist;
  double local_a8;
  double len;
  double local_88;
  double srcheight;
  secplane_t *srcplane;
  DVector3 cross;
  DVector3 v2;
  DVector3 v1;
  line_t_conflict *l;
  int i;
  int which_local;
  DVector3 *pos_local;
  int id_local;
  sector_t_conflict *sec_local;
  
  l._0_4_ = 0;
  while( true ) {
    if (sec->linecount <= (int)l) {
      return;
    }
    plVar5 = sec->lines[(int)l];
    if (plVar5->args[0] == id) break;
    l._0_4_ = (int)l + 1;
  }
  TVector3<double>::TVector3((TVector3<double> *)&v2.Z);
  TVector3<double>::TVector3((TVector3<double> *)&cross.Z);
  TVector3<double>::TVector3((TVector3<double> *)&srcplane);
  if (which == 0) {
    local_d0 = &sec->floorplane;
  }
  else {
    local_d0 = &sec->ceilingplane;
  }
  srcheight = (double)local_d0;
  if (which == 0) {
    local_d8 = sector_t::GetPlaneTexZ((sector_t *)sec,0);
  }
  else {
    local_d8 = sector_t::GetPlaneTexZ((sector_t *)sec,1);
  }
  local_88 = local_d8;
  dVar8 = pos->X;
  dVar7 = vertex_t::fX(plVar5->v2);
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,0);
  *pdVar6 = dVar8 - dVar7;
  dVar8 = pos->Y;
  dVar7 = vertex_t::fY(plVar5->v2);
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,1);
  *pdVar6 = dVar8 - dVar7;
  dVar8 = pos->Z - local_88;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&v2.Z,2);
  *pdVar6 = dVar8;
  dVar8 = pos->X;
  dVar7 = vertex_t::fX(plVar5->v1);
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,0);
  *pdVar6 = dVar8 - dVar7;
  dVar8 = pos->Y;
  dVar7 = vertex_t::fY(plVar5->v1);
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,1);
  *pdVar6 = dVar8 - dVar7;
  dVar8 = pos->Z - local_88;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&cross.Z,2);
  *pdVar6 = dVar8;
  TVector3<double>::operator^
            ((TVector3<double> *)&len,(TVector3<double> *)&v2.Z,(TVector3<double> *)&cross.Z);
  TVector3<double>::operator=((TVector3<double> *)&srcplane,(TVector3<double> *)&len);
  local_a8 = TVector3<double>::Length((TVector3<double> *)&srcplane);
  if ((local_a8 == 0.0) && (!NAN(local_a8))) {
    Printf("Slope thing at (%f,%f) lies directly on its target line.\n",pos->X,pos->Y);
    return;
  }
  TVector3<double>::operator/=((TVector3<double> *)&srcplane,local_a8);
  if (((cross.Y < 0.0) && (which == 0)) || ((0.0 < cross.Y && (which == 1)))) {
    TVector3<double>::operator-((TVector3<double> *)&dist,(TVector3<double> *)&srcplane);
    TVector3<double>::operator=((TVector3<double> *)&srcplane,(TVector3<double> *)&dist);
  }
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,0);
  dVar8 = *pdVar6;
  dVar7 = pos->X;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,1);
  dVar1 = *pdVar6;
  dVar2 = pos->Y;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,2);
  this = srcheight;
  dVar3 = *pdVar6;
  dVar4 = pos->Z;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,0);
  aa = *pdVar6;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,1);
  bb = *pdVar6;
  pdVar6 = TVector3<double>::operator[]((TVector3<double> *)&srcplane,2);
  secplane_t::set((secplane_t *)this,aa,bb,*pdVar6,(-dVar8 * dVar7 - dVar1 * dVar2) - dVar3 * dVar4)
  ;
  return;
}

Assistant:

void P_VavoomSlope(sector_t * sec, int id, const DVector3 &pos, int which)
{
	for (int i=0;i<sec->linecount;i++)
	{
		line_t * l=sec->lines[i];

		if (l->args[0]==id)
		{
			DVector3 v1, v2, cross;
			secplane_t *srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
			double srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);

			v1[0] = pos.X - l->v2->fX();
			v1[1] = pos.Y - l->v2->fY();
			v1[2] = pos.Z - srcheight;
			
			v2[0] = pos.X - l->v1->fX();
			v2[1] = pos.Y - l->v1->fY();
			v2[2] = pos.Z - srcheight;

			cross = v1 ^ v2;
			double len = cross.Length();
			if (len == 0)
			{
				Printf ("Slope thing at (%f,%f) lies directly on its target line.\n", pos.X, pos.Y);
				return;
			}
			cross /= len;

			// Fix backward normals
			if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
			{
				cross = -cross;
			}

			double dist = -cross[0] * pos.X - cross[1] * pos.Y - cross[2] * pos.Z;
			srcplane->set(cross[0], cross[1], cross[2], dist);
			return;
		}
	}
}